

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.hpp
# Opt level: O3

back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> __thiscall
pstore::diff_details::
traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
::
visit_node<std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
          (traverser<pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>>
           *this,index_pointer node,uint shifts,
          back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> out)

{
  iterator __position;
  back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_> bVar1;
  index_pointer local_10;
  
  if (((ulong)node.internal_ & 1) != 0) {
    if (shifts < 0x42) {
      bVar1 = visit_intermediate<pstore::index::details::internal_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                        (this,node,shifts,out);
      return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
             bVar1.container;
    }
    bVar1 = visit_intermediate<pstore::index::details::linear_node,std::back_insert_iterator<std::vector<pstore::address,std::allocator<pstore::address>>>>
                      (this,node,shifts,out);
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           bVar1.container;
  }
  if (((ulong)node.internal_ & 2) == 0) {
    if (*(internal_node **)(this + 0x10) <= node.internal_) {
      __position._M_current =
           ((out.container)->super__Vector_base<pstore::address,_std::allocator<pstore::address>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          ((out.container)->super__Vector_base<pstore::address,_std::allocator<pstore::address>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_10 = node;
        std::vector<pstore::address,_std::allocator<pstore::address>_>::
        _M_realloc_insert<pstore::address>(out.container,__position,&local_10.addr_);
      }
      else {
        (__position._M_current)->a_ = (value_type)node;
        ((out.container)->super__Vector_base<pstore::address,_std::allocator<pstore::address>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    return (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           (back_insert_iterator<std::vector<pstore::address,_std::allocator<pstore::address>_>_>)
           out.container;
  }
  assert_failed("node.is_address ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/diff.hpp"
                ,0x62);
}

Assistant:

OutputIterator traverser<Index>::visit_node (index_pointer node, unsigned shifts,
                                                     OutputIterator out) const {
            if (node.is_leaf ()) {
                PSTORE_ASSERT (node.is_address ());
                // If this leaf is not in the "old" byte range then add it to the output
                // collection.
                if (this->is_new (node)) {
                    *out = node.to_address ();
                    ++out;
                }
                return out;
            }

            if (index::details::depth_is_internal_node (shifts)) {
                return this->visit_intermediate<index::details::internal_node> (node, shifts,
                                                                                out);
            }

            return this->visit_intermediate<index::details::linear_node> (node, shifts, out);
        }